

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  Intersectors *pIVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 (*pauVar35) [16];
  int iVar36;
  uint uVar37;
  AABBNodeMB4D *node1;
  ulong uVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  undefined4 uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  Scene *scene;
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  vint4 bi_1;
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  vint4 bi;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  vint4 ai;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [64];
  uint uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  uint uVar112;
  uint uVar113;
  undefined1 auVar111 [64];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_15a0) [16];
  RTCFilterFunctionNArguments local_14f0;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar82 [32];
  undefined1 auVar87 [32];
  
  local_15a0 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1400._4_4_ = fVar1;
  local_1400._0_4_ = fVar1;
  local_1400._8_4_ = fVar1;
  local_1400._12_4_ = fVar1;
  auVar100 = ZEXT1664(local_1400);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1410._4_4_ = fVar2;
  local_1410._0_4_ = fVar2;
  local_1410._8_4_ = fVar2;
  local_1410._12_4_ = fVar2;
  auVar104 = ZEXT1664(local_1410);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar101 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1420._4_4_ = fVar101;
  local_1420._0_4_ = fVar101;
  local_1420._8_4_ = fVar101;
  local_1420._12_4_ = fVar101;
  auVar111 = ZEXT1664(local_1420);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar101 = fVar101 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar36 = (tray->tfar).field_0.i[k];
  auVar72 = ZEXT1664(CONCAT412(iVar36,CONCAT48(iVar36,CONCAT44(iVar36,iVar36))));
  local_1430._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1430._8_4_ = -fVar1;
  local_1430._12_4_ = -fVar1;
  auVar115 = ZEXT1664(local_1430);
  local_1440._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1440._8_4_ = -fVar2;
  local_1440._12_4_ = -fVar2;
  auVar118 = ZEXT1664(local_1440);
  iVar36 = (tray->tnear).field_0.i[k];
  local_1450._4_4_ = iVar36;
  local_1450._0_4_ = iVar36;
  local_1450._8_4_ = iVar36;
  local_1450._12_4_ = iVar36;
  auVar120 = ZEXT1664(local_1450);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  local_1460._0_8_ = CONCAT44(fVar101,fVar101) ^ 0x8000000080000000;
  local_1460._8_4_ = -fVar101;
  local_1460._12_4_ = -fVar101;
  auVar124 = ZEXT1664(local_1460);
  iVar36 = 1 << ((uint)k & 0x1f);
  auVar99._4_4_ = iVar36;
  auVar99._0_4_ = iVar36;
  auVar99._8_4_ = iVar36;
  auVar99._12_4_ = iVar36;
  auVar99._16_4_ = iVar36;
  auVar99._20_4_ = iVar36;
  auVar99._24_4_ = iVar36;
  auVar99._28_4_ = iVar36;
  auVar69 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar99 = vpand_avx2(auVar99,auVar69);
  local_1140 = vpcmpeqd_avx2(auVar99,auVar69);
  auVar80._8_4_ = 0x3f800000;
  auVar80._0_8_ = &DAT_3f8000003f800000;
  auVar80._12_4_ = 0x3f800000;
  auVar80._16_4_ = 0x3f800000;
  auVar80._20_4_ = 0x3f800000;
  auVar80._24_4_ = 0x3f800000;
  auVar80._28_4_ = 0x3f800000;
  auVar69._8_4_ = 0xbf800000;
  auVar69._0_8_ = 0xbf800000bf800000;
  auVar69._12_4_ = 0xbf800000;
  auVar69._16_4_ = 0xbf800000;
  auVar69._20_4_ = 0xbf800000;
  auVar69._24_4_ = 0xbf800000;
  auVar69._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar80,auVar69,local_1100);
  do {
    do {
      do {
        if (local_15a0 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar35 = local_15a0 + -1;
        local_15a0 = local_15a0 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar35 + 8));
      uVar62 = *(ulong *)*local_15a0;
      do {
        if ((uVar62 & 8) == 0) {
          uVar38 = uVar62 & 0xfffffffffffffff0;
          uVar43 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar73._4_4_ = uVar43;
          auVar73._0_4_ = uVar43;
          auVar73._8_4_ = uVar43;
          auVar73._12_4_ = uVar43;
          auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar41),auVar73,
                                    *(undefined1 (*) [16])(uVar38 + 0x20 + uVar41));
          auVar75 = vfmadd213ps_fma(auVar75,auVar100._0_16_,auVar115._0_16_);
          auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar60),auVar73,
                                    *(undefined1 (*) [16])(uVar38 + 0x20 + uVar60));
          auVar74 = vfmadd213ps_fma(auVar74,auVar104._0_16_,auVar118._0_16_);
          auVar75 = vpmaxsd_avx(auVar75,auVar74);
          auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar58),auVar73,
                                    *(undefined1 (*) [16])(uVar38 + 0x20 + uVar58));
          auVar74 = vfmadd213ps_fma(auVar74,auVar111._0_16_,auVar124._0_16_);
          auVar74 = vpmaxsd_avx(auVar74,auVar120._0_16_);
          auVar83 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar41 ^ 0x10)),auVar73,
                                    *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar41 ^ 0x10)));
          auVar75 = vpmaxsd_avx(auVar75,auVar74);
          auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar60 ^ 0x10)),auVar73,
                                    *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar60 ^ 0x10)));
          auVar83 = vfmadd213ps_fma(auVar83,auVar100._0_16_,auVar115._0_16_);
          auVar74 = vfmadd213ps_fma(auVar74,auVar104._0_16_,auVar118._0_16_);
          auVar74 = vpminsd_avx(auVar83,auVar74);
          auVar83 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + (uVar58 ^ 0x10)),auVar73,
                                    *(undefined1 (*) [16])(uVar38 + 0x20 + (uVar58 ^ 0x10)));
          auVar83 = vfmadd213ps_fma(auVar83,auVar111._0_16_,auVar124._0_16_);
          auVar83 = vpminsd_avx(auVar83,auVar72._0_16_);
          auVar74 = vpminsd_avx(auVar74,auVar83);
          if (((uint)uVar62 & 7) == 6) {
            auVar83 = vcmpps_avx(auVar75,auVar74,2);
            auVar74 = vcmpps_avx(*(undefined1 (*) [16])(uVar38 + 0xe0),auVar73,2);
            auVar73 = vcmpps_avx(auVar73,*(undefined1 (*) [16])(uVar38 + 0xf0),1);
            auVar74 = vandps_avx(auVar74,auVar73);
            auVar74 = vandps_avx(auVar74,auVar83);
          }
          else {
            auVar74 = vcmpps_avx(auVar75,auVar74,2);
          }
          auVar74 = vpslld_avx(auVar74,0x1f);
          uVar43 = vmovmskps_avx(auVar74);
          This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),uVar43);
          local_1320._0_16_ = auVar75;
        }
        if ((uVar62 & 8) == 0) {
          if (This == (Intersectors *)0x0) {
            iVar36 = 4;
          }
          else {
            uVar38 = uVar62 & 0xfffffffffffffff0;
            lVar40 = 0;
            for (pIVar23 = This; ((ulong)pIVar23 & 1) == 0;
                pIVar23 = (Intersectors *)((ulong)pIVar23 >> 1 | 0x8000000000000000)) {
              lVar40 = lVar40 + 1;
            }
            iVar36 = 0;
            uVar44 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
            uVar62 = *(ulong *)(uVar38 + lVar40 * 8);
            if (uVar44 != 0) {
              uVar108 = *(uint *)(local_1320 + lVar40 * 4);
              lVar40 = 0;
              for (uVar42 = uVar44; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
                lVar40 = lVar40 + 1;
              }
              uVar44 = uVar44 - 1 & uVar44;
              uVar42 = *(ulong *)(uVar38 + lVar40 * 8);
              uVar37 = *(uint *)(local_1320 + lVar40 * 4);
              if (uVar44 == 0) {
                if (uVar108 < uVar37) {
                  *(ulong *)*local_15a0 = uVar42;
                  *(uint *)(*local_15a0 + 8) = uVar37;
                  local_15a0 = local_15a0 + 1;
                }
                else {
                  *(ulong *)*local_15a0 = uVar62;
                  *(uint *)(*local_15a0 + 8) = uVar108;
                  uVar62 = uVar42;
                  local_15a0 = local_15a0 + 1;
                }
              }
              else {
                auVar75._8_8_ = 0;
                auVar75._0_8_ = uVar62;
                auVar75 = vpunpcklqdq_avx(auVar75,ZEXT416(uVar108));
                auVar74._8_8_ = 0;
                auVar74._0_8_ = uVar42;
                auVar74 = vpunpcklqdq_avx(auVar74,ZEXT416(uVar37));
                lVar40 = 0;
                for (uVar62 = uVar44; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000)
                {
                  lVar40 = lVar40 + 1;
                }
                uVar44 = uVar44 - 1 & uVar44;
                auVar83._8_8_ = 0;
                auVar83._0_8_ = *(ulong *)(uVar38 + lVar40 * 8);
                auVar73 = vpunpcklqdq_avx(auVar83,ZEXT416(*(uint *)(local_1320 + lVar40 * 4)));
                auVar83 = vpcmpgtd_avx(auVar74,auVar75);
                if (uVar44 == 0) {
                  auVar91 = vpshufd_avx(auVar83,0xaa);
                  auVar83 = vblendvps_avx(auVar74,auVar75,auVar91);
                  auVar75 = vblendvps_avx(auVar75,auVar74,auVar91);
                  auVar74 = vpcmpgtd_avx(auVar73,auVar83);
                  auVar91 = vpshufd_avx(auVar74,0xaa);
                  auVar74 = vblendvps_avx(auVar73,auVar83,auVar91);
                  auVar83 = vblendvps_avx(auVar83,auVar73,auVar91);
                  auVar73 = vpcmpgtd_avx(auVar83,auVar75);
                  auVar91 = vpshufd_avx(auVar73,0xaa);
                  auVar73 = vblendvps_avx(auVar83,auVar75,auVar91);
                  auVar75 = vblendvps_avx(auVar75,auVar83,auVar91);
                  *local_15a0 = auVar75;
                  local_15a0[1] = auVar73;
                  uVar62 = auVar74._0_8_;
                  local_15a0 = local_15a0 + 2;
                }
                else {
                  lVar40 = 0;
                  for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                    lVar40 = lVar40 + 1;
                  }
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = *(ulong *)(uVar38 + lVar40 * 8);
                  auVar63 = vpunpcklqdq_avx(auVar91,ZEXT416(*(uint *)(local_1320 + lVar40 * 4)));
                  auVar91 = vpshufd_avx(auVar83,0xaa);
                  auVar83 = vblendvps_avx(auVar74,auVar75,auVar91);
                  auVar75 = vblendvps_avx(auVar75,auVar74,auVar91);
                  auVar74 = vpcmpgtd_avx(auVar63,auVar73);
                  auVar91 = vpshufd_avx(auVar74,0xaa);
                  auVar74 = vblendvps_avx(auVar63,auVar73,auVar91);
                  auVar73 = vblendvps_avx(auVar73,auVar63,auVar91);
                  auVar91 = vpcmpgtd_avx(auVar73,auVar75);
                  auVar63 = vpshufd_avx(auVar91,0xaa);
                  auVar91 = vblendvps_avx(auVar73,auVar75,auVar63);
                  auVar75 = vblendvps_avx(auVar75,auVar73,auVar63);
                  auVar73 = vpcmpgtd_avx(auVar74,auVar83);
                  auVar63 = vpshufd_avx(auVar73,0xaa);
                  auVar73 = vblendvps_avx(auVar74,auVar83,auVar63);
                  auVar74 = vblendvps_avx(auVar83,auVar74,auVar63);
                  auVar83 = vpcmpgtd_avx(auVar91,auVar74);
                  auVar63 = vpshufd_avx(auVar83,0xaa);
                  auVar83 = vblendvps_avx(auVar91,auVar74,auVar63);
                  auVar74 = vblendvps_avx(auVar74,auVar91,auVar63);
                  *local_15a0 = auVar75;
                  local_15a0[1] = auVar74;
                  local_15a0[2] = auVar83;
                  uVar62 = auVar73._0_8_;
                  local_15a0 = local_15a0 + 3;
                }
              }
            }
          }
        }
        else {
          iVar36 = 6;
        }
      } while (iVar36 == 0);
    } while (iVar36 != 6);
    uVar38 = (ulong)((uint)uVar62 & 0xf);
    if (uVar38 != 8) {
      uVar62 = uVar62 & 0xfffffffffffffff0;
      lVar40 = 0;
      do {
        lVar39 = lVar40 * 0x60;
        pSVar7 = context->scene;
        pRVar8 = (pSVar7->geometries).items;
        pGVar9 = pRVar8[*(uint *)(uVar62 + 0x40 + lVar39)].ptr;
        fVar1 = (pGVar9->time_range).lower;
        fVar1 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar9->time_range).upper - fVar1));
        auVar75 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
        auVar75 = vminss_avx(auVar75,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
        auVar14 = vmaxss_avx(ZEXT816(0) << 0x20,auVar75);
        iVar36 = (int)auVar14._0_4_;
        lVar52 = (long)iVar36 * 0x38;
        lVar10 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar52);
        uVar51 = (ulong)*(uint *)(uVar62 + 4 + lVar39);
        auVar75 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar62 + lVar39) * 4);
        uVar42 = (ulong)*(uint *)(uVar62 + 0x10 + lVar39);
        auVar74 = *(undefined1 (*) [16])(lVar10 + uVar42 * 4);
        uVar45 = (ulong)*(uint *)(uVar62 + 0x20 + lVar39);
        auVar83 = *(undefined1 (*) [16])(lVar10 + uVar45 * 4);
        uVar46 = (ulong)*(uint *)(uVar62 + 0x30 + lVar39);
        auVar73 = *(undefined1 (*) [16])(lVar10 + uVar46 * 4);
        lVar10 = *(long *)&pRVar8[*(uint *)(uVar62 + 0x44 + lVar39)].ptr[2].numPrimitives;
        lVar11 = *(long *)(lVar10 + lVar52);
        auVar91 = *(undefined1 (*) [16])(lVar11 + uVar51 * 4);
        uVar47 = (ulong)*(uint *)(uVar62 + 0x14 + lVar39);
        auVar63 = *(undefined1 (*) [16])(lVar11 + uVar47 * 4);
        uVar48 = (ulong)*(uint *)(uVar62 + 0x24 + lVar39);
        auVar79 = *(undefined1 (*) [16])(lVar11 + uVar48 * 4);
        uVar49 = (ulong)*(uint *)(uVar62 + 0x34 + lVar39);
        auVar85 = *(undefined1 (*) [16])(lVar11 + uVar49 * 4);
        lVar11 = *(long *)&pRVar8[*(uint *)(uVar62 + 0x48 + lVar39)].ptr[2].numPrimitives;
        lVar12 = *(long *)(lVar11 + lVar52);
        uVar50 = (ulong)*(uint *)(uVar62 + 8 + lVar39);
        auVar4 = *(undefined1 (*) [16])(lVar12 + uVar50 * 4);
        uVar61 = (ulong)*(uint *)(uVar62 + 0x18 + lVar39);
        auVar5 = *(undefined1 (*) [16])(lVar12 + uVar61 * 4);
        uVar54 = (ulong)*(uint *)(uVar62 + 0x28 + lVar39);
        auVar6 = *(undefined1 (*) [16])(lVar12 + uVar54 * 4);
        uVar55 = (ulong)*(uint *)(uVar62 + 0x38 + lVar39);
        auVar78 = *(undefined1 (*) [16])(lVar12 + uVar55 * 4);
        fVar1 = fVar1 - auVar14._0_4_;
        lVar12 = *(long *)&pRVar8[*(uint *)(uVar62 + 0x4c + lVar39)].ptr[2].numPrimitives;
        lVar52 = *(long *)(lVar12 + lVar52);
        uVar44 = (ulong)*(uint *)(uVar62 + 0xc + lVar39);
        auVar14 = *(undefined1 (*) [16])(lVar52 + uVar44 * 4);
        uVar57 = (ulong)*(uint *)(uVar62 + 0x1c + lVar39);
        auVar92 = *(undefined1 (*) [16])(lVar52 + uVar57 * 4);
        auVar76 = vunpcklps_avx(auVar75,auVar4);
        auVar4 = vunpckhps_avx(auVar75,auVar4);
        auVar84 = vunpcklps_avx(auVar91,auVar14);
        auVar91 = vunpckhps_avx(auVar91,auVar14);
        uVar53 = (ulong)*(uint *)(uVar62 + 0x2c + lVar39);
        auVar75 = *(undefined1 (*) [16])(lVar52 + uVar53 * 4);
        local_1360 = vunpcklps_avx(auVar4,auVar91);
        local_13a0 = vunpcklps_avx(auVar76,auVar84);
        local_1380 = vunpckhps_avx(auVar76,auVar84);
        auVar4 = vunpcklps_avx(auVar74,auVar5);
        auVar91 = vunpckhps_avx(auVar74,auVar5);
        auVar5 = vunpcklps_avx(auVar63,auVar92);
        auVar63 = vunpckhps_avx(auVar63,auVar92);
        uVar56 = (ulong)*(uint *)(uVar62 + 0x3c + lVar39);
        auVar74 = *(undefined1 (*) [16])(lVar52 + uVar56 * 4);
        local_1350 = vunpcklps_avx(auVar91,auVar63);
        local_1390 = vunpcklps_avx(auVar4,auVar5);
        local_1370 = vunpckhps_avx(auVar4,auVar5);
        auVar63 = vunpcklps_avx(auVar83,auVar6);
        auVar83 = vunpckhps_avx(auVar83,auVar6);
        auVar4 = vunpcklps_avx(auVar79,auVar75);
        auVar91 = vunpckhps_avx(auVar79,auVar75);
        lVar59 = (long)(iVar36 + 1) * 0x38;
        lVar52 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar59);
        auVar75 = *(undefined1 (*) [16])(lVar52 + (ulong)*(uint *)(uVar62 + lVar39) * 4);
        local_13b0 = vunpcklps_avx(auVar83,auVar91);
        local_13e0 = vunpcklps_avx(auVar63,auVar4);
        local_13d0 = vunpckhps_avx(auVar63,auVar4);
        auVar91 = vunpcklps_avx(auVar73,auVar78);
        auVar83 = vunpckhps_avx(auVar73,auVar78);
        auVar63 = vunpcklps_avx(auVar85,auVar74);
        auVar73 = vunpckhps_avx(auVar85,auVar74);
        lVar11 = *(long *)(lVar11 + lVar59);
        auVar74 = *(undefined1 (*) [16])(lVar11 + uVar50 * 4);
        local_13c0 = vunpcklps_avx(auVar83,auVar73);
        auVar79 = vunpcklps_avx(auVar91,auVar63);
        local_13f0 = vunpckhps_avx(auVar91,auVar63);
        lVar10 = *(long *)(lVar10 + lVar59);
        auVar73 = vunpcklps_avx(auVar75,auVar74);
        auVar83 = vunpckhps_avx(auVar75,auVar74);
        auVar75 = *(undefined1 (*) [16])(lVar10 + uVar51 * 4);
        lVar12 = *(long *)(lVar12 + lVar59);
        auVar74 = *(undefined1 (*) [16])(lVar12 + uVar44 * 4);
        auVar91 = vunpcklps_avx(auVar75,auVar74);
        auVar75 = vunpckhps_avx(auVar75,auVar74);
        auVar85 = vunpcklps_avx(auVar83,auVar75);
        auVar4 = vunpcklps_avx(auVar73,auVar91);
        auVar83 = vunpckhps_avx(auVar73,auVar91);
        auVar75 = *(undefined1 (*) [16])(lVar52 + uVar42 * 4);
        auVar74 = *(undefined1 (*) [16])(lVar11 + uVar61 * 4);
        auVar91 = vunpcklps_avx(auVar75,auVar74);
        auVar73 = vunpckhps_avx(auVar75,auVar74);
        auVar75 = *(undefined1 (*) [16])(lVar10 + uVar47 * 4);
        auVar74 = *(undefined1 (*) [16])(lVar12 + uVar57 * 4);
        auVar63 = vunpcklps_avx(auVar75,auVar74);
        auVar75 = vunpckhps_avx(auVar75,auVar74);
        auVar5 = vunpcklps_avx(auVar73,auVar75);
        auVar6 = vunpcklps_avx(auVar91,auVar63);
        auVar73 = vunpckhps_avx(auVar91,auVar63);
        auVar75 = *(undefined1 (*) [16])(lVar52 + uVar45 * 4);
        auVar74 = *(undefined1 (*) [16])(lVar11 + uVar54 * 4);
        auVar63 = vunpcklps_avx(auVar75,auVar74);
        auVar91 = vunpckhps_avx(auVar75,auVar74);
        auVar75 = *(undefined1 (*) [16])(lVar10 + uVar48 * 4);
        auVar74 = *(undefined1 (*) [16])(lVar12 + uVar53 * 4);
        auVar78 = vunpcklps_avx(auVar75,auVar74);
        auVar75 = vunpckhps_avx(auVar75,auVar74);
        auVar14 = vunpcklps_avx(auVar91,auVar75);
        auVar92 = vunpcklps_avx(auVar63,auVar78);
        auVar91 = vunpckhps_avx(auVar63,auVar78);
        auVar75 = *(undefined1 (*) [16])(lVar52 + uVar46 * 4);
        auVar74 = *(undefined1 (*) [16])(lVar11 + uVar55 * 4);
        auVar78 = vunpcklps_avx(auVar75,auVar74);
        auVar63 = vunpckhps_avx(auVar75,auVar74);
        auVar75 = *(undefined1 (*) [16])(lVar10 + uVar49 * 4);
        auVar74 = *(undefined1 (*) [16])(lVar12 + uVar56 * 4);
        auVar76 = vunpcklps_avx(auVar75,auVar74);
        auVar75 = vunpckhps_avx(auVar75,auVar74);
        auVar74 = vunpcklps_avx(auVar63,auVar75);
        auVar63 = vunpcklps_avx(auVar78,auVar76);
        auVar75 = vunpckhps_avx(auVar78,auVar76);
        fVar2 = 1.0 - fVar1;
        auVar76._4_4_ = fVar2;
        auVar76._0_4_ = fVar2;
        auVar76._8_4_ = fVar2;
        auVar76._12_4_ = fVar2;
        auVar84._0_4_ = fVar1 * auVar4._0_4_;
        auVar84._4_4_ = fVar1 * auVar4._4_4_;
        auVar84._8_4_ = fVar1 * auVar4._8_4_;
        auVar84._12_4_ = fVar1 * auVar4._12_4_;
        auVar4 = vfmadd231ps_fma(auVar84,auVar76,local_13a0);
        auVar93._0_4_ = fVar1 * auVar83._0_4_;
        auVar93._4_4_ = fVar1 * auVar83._4_4_;
        auVar93._8_4_ = fVar1 * auVar83._8_4_;
        auVar93._12_4_ = fVar1 * auVar83._12_4_;
        auVar83 = vfmadd231ps_fma(auVar93,auVar76,local_1380);
        auVar88._0_4_ = auVar85._0_4_ * fVar1;
        auVar88._4_4_ = auVar85._4_4_ * fVar1;
        auVar88._8_4_ = auVar85._8_4_ * fVar1;
        auVar88._12_4_ = auVar85._12_4_ * fVar1;
        auVar85 = vfmadd231ps_fma(auVar88,auVar76,local_1360);
        auVar78._0_4_ = fVar1 * auVar6._0_4_;
        auVar78._4_4_ = fVar1 * auVar6._4_4_;
        auVar78._8_4_ = fVar1 * auVar6._8_4_;
        auVar78._12_4_ = fVar1 * auVar6._12_4_;
        auVar6 = vfmadd231ps_fma(auVar78,auVar76,local_1390);
        auVar96._0_4_ = fVar1 * auVar73._0_4_;
        auVar96._4_4_ = fVar1 * auVar73._4_4_;
        auVar96._8_4_ = fVar1 * auVar73._8_4_;
        auVar96._12_4_ = fVar1 * auVar73._12_4_;
        auVar73 = vfmadd231ps_fma(auVar96,auVar76,local_1370);
        auVar121._0_4_ = auVar5._0_4_ * fVar1;
        auVar121._4_4_ = auVar5._4_4_ * fVar1;
        auVar121._8_4_ = auVar5._8_4_ * fVar1;
        auVar121._12_4_ = auVar5._12_4_ * fVar1;
        auVar5 = vfmadd231ps_fma(auVar121,auVar76,local_1350);
        auVar109._0_4_ = auVar92._0_4_ * fVar1;
        auVar109._4_4_ = auVar92._4_4_ * fVar1;
        auVar109._8_4_ = auVar92._8_4_ * fVar1;
        auVar109._12_4_ = auVar92._12_4_ * fVar1;
        auVar78 = vfmadd231ps_fma(auVar109,auVar76,local_13e0);
        auVar116._0_4_ = auVar91._0_4_ * fVar1;
        auVar116._4_4_ = auVar91._4_4_ * fVar1;
        auVar116._8_4_ = auVar91._8_4_ * fVar1;
        auVar116._12_4_ = auVar91._12_4_ * fVar1;
        auVar91 = vfmadd231ps_fma(auVar116,auVar76,local_13d0);
        auVar126._0_4_ = auVar14._0_4_ * fVar1;
        auVar126._4_4_ = auVar14._4_4_ * fVar1;
        auVar126._8_4_ = auVar14._8_4_ * fVar1;
        auVar126._12_4_ = auVar14._12_4_ * fVar1;
        auVar14 = vfmadd231ps_fma(auVar126,auVar76,local_13b0);
        auVar92._0_4_ = fVar1 * auVar63._0_4_;
        auVar92._4_4_ = fVar1 * auVar63._4_4_;
        auVar92._8_4_ = fVar1 * auVar63._8_4_;
        auVar92._12_4_ = fVar1 * auVar63._12_4_;
        auVar102._0_4_ = auVar75._0_4_ * fVar1;
        auVar102._4_4_ = auVar75._4_4_ * fVar1;
        auVar102._8_4_ = auVar75._8_4_ * fVar1;
        auVar102._12_4_ = auVar75._12_4_ * fVar1;
        auVar63._0_4_ = auVar74._0_4_ * fVar1;
        auVar63._4_4_ = auVar74._4_4_ * fVar1;
        auVar63._8_4_ = auVar74._8_4_ * fVar1;
        auVar63._12_4_ = auVar74._12_4_ * fVar1;
        auVar75 = vfmadd231ps_fma(auVar92,auVar76,auVar79);
        auVar74 = vfmadd231ps_fma(auVar102,auVar76,local_13f0);
        lVar10 = uVar62 + 0x40 + lVar39;
        local_10e0 = *(undefined8 *)(lVar10 + 0x10);
        uStack_10d8 = *(undefined8 *)(lVar10 + 0x18);
        uStack_10d0 = local_10e0;
        uStack_10c8 = uStack_10d8;
        lVar39 = uVar62 + 0x50 + lVar39;
        local_1340 = *(undefined8 *)(lVar39 + 0x10);
        uStack_1338 = *(undefined8 *)(lVar39 + 0x18);
        auVar63 = vfmadd231ps_fma(auVar63,auVar76,local_13c0);
        uStack_1330 = local_1340;
        uStack_1328 = uStack_1338;
        auVar86._16_16_ = auVar78;
        auVar86._0_16_ = auVar4;
        auVar125._16_16_ = auVar91;
        auVar125._0_16_ = auVar83;
        auVar127._16_16_ = auVar14;
        auVar127._0_16_ = auVar85;
        auVar77._16_16_ = auVar6;
        auVar77._0_16_ = auVar6;
        auVar81._16_16_ = auVar73;
        auVar81._0_16_ = auVar73;
        auVar89._16_16_ = auVar5;
        auVar89._0_16_ = auVar5;
        auVar94._16_16_ = auVar75;
        auVar94._0_16_ = auVar75;
        auVar97._16_16_ = auVar74;
        auVar97._0_16_ = auVar74;
        auVar64._16_16_ = auVar63;
        auVar64._0_16_ = auVar63;
        auVar69 = vsubps_avx(auVar86,auVar77);
        auVar99 = vsubps_avx(auVar125,auVar81);
        auVar80 = vsubps_avx(auVar127,auVar89);
        auVar67 = vsubps_avx(auVar94,auVar86);
        auVar20 = vsubps_avx(auVar97,auVar125);
        auVar21 = vsubps_avx(auVar64,auVar127);
        auVar22._4_4_ = auVar99._4_4_ * auVar21._4_4_;
        auVar22._0_4_ = auVar99._0_4_ * auVar21._0_4_;
        auVar22._8_4_ = auVar99._8_4_ * auVar21._8_4_;
        auVar22._12_4_ = auVar99._12_4_ * auVar21._12_4_;
        auVar22._16_4_ = auVar99._16_4_ * auVar21._16_4_;
        auVar22._20_4_ = auVar99._20_4_ * auVar21._20_4_;
        auVar22._24_4_ = auVar99._24_4_ * auVar21._24_4_;
        auVar22._28_4_ = auVar6._12_4_;
        auVar73 = vfmsub231ps_fma(auVar22,auVar20,auVar80);
        auVar122._0_4_ = auVar80._0_4_ * auVar67._0_4_;
        auVar122._4_4_ = auVar80._4_4_ * auVar67._4_4_;
        auVar122._8_4_ = auVar80._8_4_ * auVar67._8_4_;
        auVar122._12_4_ = auVar80._12_4_ * auVar67._12_4_;
        auVar122._16_4_ = auVar80._16_4_ * auVar67._16_4_;
        auVar122._20_4_ = auVar80._20_4_ * auVar67._20_4_;
        auVar122._24_4_ = auVar80._24_4_ * auVar67._24_4_;
        auVar122._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar122,auVar21,auVar69);
        uVar43 = *(undefined4 *)(ray + k * 4);
        auVar90._4_4_ = uVar43;
        auVar90._0_4_ = uVar43;
        auVar90._8_4_ = uVar43;
        auVar90._12_4_ = uVar43;
        auVar90._16_4_ = uVar43;
        auVar90._20_4_ = uVar43;
        auVar90._24_4_ = uVar43;
        auVar90._28_4_ = uVar43;
        uVar43 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar98._4_4_ = uVar43;
        auVar98._0_4_ = uVar43;
        auVar98._8_4_ = uVar43;
        auVar98._12_4_ = uVar43;
        auVar98._16_4_ = uVar43;
        auVar98._20_4_ = uVar43;
        auVar98._24_4_ = uVar43;
        auVar98._28_4_ = uVar43;
        uVar43 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar65._4_4_ = uVar43;
        auVar65._0_4_ = uVar43;
        auVar65._8_4_ = uVar43;
        auVar65._12_4_ = uVar43;
        auVar65._16_4_ = uVar43;
        auVar65._20_4_ = uVar43;
        auVar65._24_4_ = uVar43;
        auVar65._28_4_ = uVar43;
        fVar1 = *(float *)(ray + k * 4 + 0x80);
        auVar114._4_4_ = fVar1;
        auVar114._0_4_ = fVar1;
        auVar114._8_4_ = fVar1;
        auVar114._12_4_ = fVar1;
        auVar114._16_4_ = fVar1;
        auVar114._20_4_ = fVar1;
        auVar114._24_4_ = fVar1;
        auVar114._28_4_ = fVar1;
        auVar22 = vsubps_avx(auVar86,auVar90);
        fVar2 = *(float *)(ray + k * 4 + 0xa0);
        auVar119._4_4_ = fVar2;
        auVar119._0_4_ = fVar2;
        auVar119._8_4_ = fVar2;
        auVar119._12_4_ = fVar2;
        auVar119._16_4_ = fVar2;
        auVar119._20_4_ = fVar2;
        auVar119._24_4_ = fVar2;
        auVar119._28_4_ = fVar2;
        auVar64 = vsubps_avx(auVar125,auVar98);
        local_1280 = ZEXT1632(auVar91);
        fVar101 = *(float *)(ray + k * 4 + 0xc0);
        auVar123._4_4_ = fVar101;
        auVar123._0_4_ = fVar101;
        auVar123._8_4_ = fVar101;
        auVar123._12_4_ = fVar101;
        auVar123._16_4_ = fVar101;
        auVar123._20_4_ = fVar101;
        auVar123._24_4_ = fVar101;
        auVar123._28_4_ = fVar101;
        auVar65 = vsubps_avx(auVar127,auVar65);
        auVar24._4_4_ = fVar1 * auVar64._4_4_;
        auVar24._0_4_ = fVar1 * auVar64._0_4_;
        auVar24._8_4_ = fVar1 * auVar64._8_4_;
        auVar24._12_4_ = fVar1 * auVar64._12_4_;
        auVar24._16_4_ = fVar1 * auVar64._16_4_;
        auVar24._20_4_ = fVar1 * auVar64._20_4_;
        auVar24._24_4_ = fVar1 * auVar64._24_4_;
        auVar24._28_4_ = uVar43;
        auVar75 = vfmsub231ps_fma(auVar24,auVar22,auVar119);
        auVar25._4_4_ = auVar21._4_4_ * auVar75._4_4_;
        auVar25._0_4_ = auVar21._0_4_ * auVar75._0_4_;
        auVar25._8_4_ = auVar21._8_4_ * auVar75._8_4_;
        auVar25._12_4_ = auVar21._12_4_ * auVar75._12_4_;
        auVar25._16_4_ = auVar21._16_4_ * 0.0;
        auVar25._20_4_ = auVar21._20_4_ * 0.0;
        auVar25._24_4_ = auVar21._24_4_ * 0.0;
        auVar25._28_4_ = auVar21._28_4_;
        auVar66._0_4_ = auVar80._0_4_ * auVar75._0_4_;
        auVar66._4_4_ = auVar80._4_4_ * auVar75._4_4_;
        auVar66._8_4_ = auVar80._8_4_ * auVar75._8_4_;
        auVar66._12_4_ = auVar80._12_4_ * auVar75._12_4_;
        auVar66._16_4_ = auVar80._16_4_ * 0.0;
        auVar66._20_4_ = auVar80._20_4_ * 0.0;
        auVar66._24_4_ = auVar80._24_4_ * 0.0;
        auVar66._28_4_ = 0;
        auVar21._4_4_ = fVar101 * auVar22._4_4_;
        auVar21._0_4_ = fVar101 * auVar22._0_4_;
        auVar21._8_4_ = fVar101 * auVar22._8_4_;
        auVar21._12_4_ = fVar101 * auVar22._12_4_;
        auVar21._16_4_ = fVar101 * auVar22._16_4_;
        auVar21._20_4_ = fVar101 * auVar22._20_4_;
        auVar21._24_4_ = fVar101 * auVar22._24_4_;
        auVar21._28_4_ = auVar80._28_4_;
        auVar74 = vfmsub231ps_fma(auVar21,auVar65,auVar114);
        auVar75 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar74),auVar20);
        auVar74 = vfmadd231ps_fma(auVar66,auVar99,ZEXT1632(auVar74));
        auVar26._4_4_ = auVar69._4_4_ * auVar20._4_4_;
        auVar26._0_4_ = auVar69._0_4_ * auVar20._0_4_;
        auVar26._8_4_ = auVar69._8_4_ * auVar20._8_4_;
        auVar26._12_4_ = auVar69._12_4_ * auVar20._12_4_;
        auVar26._16_4_ = auVar69._16_4_ * auVar20._16_4_;
        auVar26._20_4_ = auVar69._20_4_ * auVar20._20_4_;
        auVar26._24_4_ = auVar69._24_4_ * auVar20._24_4_;
        auVar26._28_4_ = auVar20._28_4_;
        auVar63 = vfmsub231ps_fma(auVar26,auVar67,auVar99);
        auVar20._4_4_ = fVar2 * auVar65._4_4_;
        auVar20._0_4_ = fVar2 * auVar65._0_4_;
        auVar20._8_4_ = fVar2 * auVar65._8_4_;
        auVar20._12_4_ = fVar2 * auVar65._12_4_;
        auVar20._16_4_ = fVar2 * auVar65._16_4_;
        auVar20._20_4_ = fVar2 * auVar65._20_4_;
        auVar20._24_4_ = fVar2 * auVar65._24_4_;
        auVar20._28_4_ = auVar99._28_4_;
        auVar79 = vfmsub231ps_fma(auVar20,auVar64,auVar123);
        fVar1 = auVar63._0_4_;
        fVar2 = auVar63._4_4_;
        auVar27._4_4_ = fVar101 * fVar2;
        auVar27._0_4_ = fVar101 * fVar1;
        fVar15 = auVar63._8_4_;
        auVar27._8_4_ = fVar101 * fVar15;
        fVar16 = auVar63._12_4_;
        auVar27._12_4_ = fVar101 * fVar16;
        auVar27._16_4_ = fVar101 * 0.0;
        auVar27._20_4_ = fVar101 * 0.0;
        auVar27._24_4_ = fVar101 * 0.0;
        auVar27._28_4_ = fVar101;
        auVar83 = vfmadd231ps_fma(auVar27,local_1280,auVar119);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar73),auVar114);
        auVar110._8_4_ = 0x80000000;
        auVar110._0_8_ = 0x8000000080000000;
        auVar110._12_4_ = 0x80000000;
        auVar110._16_4_ = 0x80000000;
        auVar110._20_4_ = 0x80000000;
        auVar110._24_4_ = 0x80000000;
        auVar110._28_4_ = 0x80000000;
        auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),ZEXT1632(auVar79),auVar67);
        auVar99 = vandps_avx(ZEXT1632(auVar83),auVar110);
        uVar108 = auVar99._0_4_;
        auVar95._0_4_ = (float)(uVar108 ^ auVar75._0_4_);
        uVar37 = auVar99._4_4_;
        auVar95._4_4_ = (float)(uVar37 ^ auVar75._4_4_);
        uVar112 = auVar99._8_4_;
        auVar95._8_4_ = (float)(uVar112 ^ auVar75._8_4_);
        uVar113 = auVar99._12_4_;
        auVar95._12_4_ = (float)(uVar113 ^ auVar75._12_4_);
        local_12e0._16_4_ = auVar99._16_4_;
        auVar95._16_4_ = local_12e0._16_4_;
        local_12e0._20_4_ = auVar99._20_4_;
        auVar95._20_4_ = local_12e0._20_4_;
        local_12e0._24_4_ = auVar99._24_4_;
        auVar95._24_4_ = local_12e0._24_4_;
        local_12e0._28_4_ = auVar99._28_4_;
        auVar95._28_4_ = local_12e0._28_4_;
        auVar75 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar69,ZEXT1632(auVar79));
        local_1300._0_4_ = (float)(uVar108 ^ auVar75._0_4_);
        local_1300._4_4_ = (float)(uVar37 ^ auVar75._4_4_);
        local_1300._8_4_ = (float)(uVar112 ^ auVar75._8_4_);
        local_1300._12_4_ = (float)(uVar113 ^ auVar75._12_4_);
        local_1300._16_4_ = local_12e0._16_4_;
        local_1300._20_4_ = local_12e0._20_4_;
        local_1300._24_4_ = local_12e0._24_4_;
        local_1300._28_4_ = local_12e0._28_4_;
        auVar69 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar99 = vcmpps_avx(auVar95,auVar69,5);
        auVar69 = vcmpps_avx(local_1300,auVar69,5);
        auVar99 = vandps_avx(auVar69,auVar99);
        auVar103._8_4_ = 0x7fffffff;
        auVar103._0_8_ = 0x7fffffff7fffffff;
        auVar103._12_4_ = 0x7fffffff;
        auVar103._16_4_ = 0x7fffffff;
        auVar103._20_4_ = 0x7fffffff;
        auVar103._24_4_ = 0x7fffffff;
        auVar103._28_4_ = 0x7fffffff;
        local_12c0 = vandps_avx(ZEXT1632(auVar83),auVar103);
        auVar69 = vcmpps_avx(ZEXT1632(auVar83),ZEXT1232(ZEXT412(0)) << 0x20,4);
        auVar99 = vandps_avx(auVar69,auVar99);
        auVar67._0_4_ = auVar95._0_4_ + local_1300._0_4_;
        auVar67._4_4_ = auVar95._4_4_ + local_1300._4_4_;
        auVar67._8_4_ = auVar95._8_4_ + local_1300._8_4_;
        auVar67._12_4_ = auVar95._12_4_ + local_1300._12_4_;
        auVar67._16_4_ = local_12e0._16_4_ + local_12e0._16_4_;
        auVar67._20_4_ = local_12e0._20_4_ + local_12e0._20_4_;
        auVar67._24_4_ = local_12e0._24_4_ + local_12e0._24_4_;
        auVar67._28_4_ = local_12e0._28_4_ + local_12e0._28_4_;
        auVar69 = vcmpps_avx(auVar67,local_12c0,2);
        auVar80 = auVar69 & auVar99;
        if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar80 >> 0x7f,0) != '\0') ||
              (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0xbf,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar80[0x1f] < '\0') {
          auVar99 = vandps_avx(auVar99,auVar69);
          auVar75 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
          auVar28._4_4_ = fVar2 * auVar65._4_4_;
          auVar28._0_4_ = fVar1 * auVar65._0_4_;
          auVar28._8_4_ = fVar15 * auVar65._8_4_;
          auVar28._12_4_ = fVar16 * auVar65._12_4_;
          auVar28._16_4_ = auVar65._16_4_ * 0.0;
          auVar28._20_4_ = auVar65._20_4_ * 0.0;
          auVar28._24_4_ = auVar65._24_4_ * 0.0;
          auVar28._28_4_ = auVar65._28_4_;
          auVar74 = vfmadd213ps_fma(auVar64,local_1280,auVar28);
          auVar74 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar73),ZEXT1632(auVar74));
          local_12e0._0_4_ = (float)(uVar108 ^ auVar74._0_4_);
          local_12e0._4_4_ = (float)(uVar37 ^ auVar74._4_4_);
          local_12e0._8_4_ = (float)(uVar112 ^ auVar74._8_4_);
          local_12e0._12_4_ = (float)(uVar113 ^ auVar74._12_4_);
          fVar101 = *(float *)(ray + k * 4 + 0x60);
          auVar29._4_4_ = local_12c0._4_4_ * fVar101;
          auVar29._0_4_ = local_12c0._0_4_ * fVar101;
          auVar29._8_4_ = local_12c0._8_4_ * fVar101;
          auVar29._12_4_ = local_12c0._12_4_ * fVar101;
          auVar29._16_4_ = local_12c0._16_4_ * fVar101;
          auVar29._20_4_ = local_12c0._20_4_ * fVar101;
          auVar29._24_4_ = local_12c0._24_4_ * fVar101;
          auVar29._28_4_ = fVar101;
          auVar99 = vcmpps_avx(auVar29,local_12e0,1);
          fVar101 = *(float *)(ray + k * 4 + 0x100);
          auVar30._4_4_ = local_12c0._4_4_ * fVar101;
          auVar30._0_4_ = local_12c0._0_4_ * fVar101;
          auVar30._8_4_ = local_12c0._8_4_ * fVar101;
          auVar30._12_4_ = local_12c0._12_4_ * fVar101;
          auVar30._16_4_ = local_12c0._16_4_ * fVar101;
          auVar30._20_4_ = local_12c0._20_4_ * fVar101;
          auVar30._24_4_ = local_12c0._24_4_ * fVar101;
          auVar30._28_4_ = fVar101;
          auVar69 = vcmpps_avx(local_12e0,auVar30,2);
          auVar99 = vandps_avx(auVar99,auVar69);
          auVar74 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
          auVar75 = vpand_avx(auVar74,auVar75);
          auVar99 = vpmovzxwd_avx2(auVar75);
          auVar99 = vpslld_avx2(auVar99,0x1f);
          if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar99 >> 0x7f,0) != '\0') ||
                (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar99 >> 0xbf,0) != '\0') ||
              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar99[0x1f] < '\0') {
            local_14c0 = vpsrad_avx2(auVar99,0x1f);
            local_1320 = auVar95;
            local_12a0 = ZEXT1632(auVar73);
            local_1260 = ZEXT1632(auVar63);
            local_1240 = local_14c0;
            local_1160 = local_1100;
            auVar69 = vrcpps_avx(local_12c0);
            auVar117._8_4_ = 0x3f800000;
            auVar117._0_8_ = &DAT_3f8000003f800000;
            auVar117._12_4_ = 0x3f800000;
            auVar117._16_4_ = 0x3f800000;
            auVar117._20_4_ = 0x3f800000;
            auVar117._24_4_ = 0x3f800000;
            auVar117._28_4_ = 0x3f800000;
            auVar74 = vfnmadd213ps_fma(local_12c0,auVar69,auVar117);
            auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar69,auVar69);
            fVar101 = auVar74._0_4_;
            fVar105 = auVar74._4_4_;
            local_11e0._4_4_ = fVar105 * local_12e0._4_4_;
            local_11e0._0_4_ = fVar101 * local_12e0._0_4_;
            fVar106 = auVar74._8_4_;
            local_11e0._8_4_ = fVar106 * local_12e0._8_4_;
            fVar107 = auVar74._12_4_;
            local_11e0._12_4_ = fVar107 * local_12e0._12_4_;
            local_11e0._16_4_ = local_12e0._16_4_ * 0.0;
            local_11e0._20_4_ = local_12e0._20_4_ * 0.0;
            local_11e0._24_4_ = local_12e0._24_4_ * 0.0;
            local_11e0._28_4_ = local_12e0._28_4_;
            auVar72 = ZEXT3264(local_11e0);
            auVar31._4_4_ = fVar105 * auVar95._4_4_;
            auVar31._0_4_ = fVar101 * auVar95._0_4_;
            auVar31._8_4_ = fVar106 * auVar95._8_4_;
            auVar31._12_4_ = fVar107 * auVar95._12_4_;
            auVar31._16_4_ = local_12e0._16_4_ * 0.0;
            auVar31._20_4_ = local_12e0._20_4_ * 0.0;
            auVar31._24_4_ = local_12e0._24_4_ * 0.0;
            auVar31._28_4_ = auVar69._28_4_;
            auVar69 = vminps_avx(auVar31,auVar117);
            auVar32._4_4_ = fVar105 * local_1300._4_4_;
            auVar32._0_4_ = fVar101 * local_1300._0_4_;
            auVar32._8_4_ = fVar106 * local_1300._8_4_;
            auVar32._12_4_ = fVar107 * local_1300._12_4_;
            auVar32._16_4_ = local_12e0._16_4_ * 0.0;
            auVar32._20_4_ = local_12e0._20_4_ * 0.0;
            auVar32._24_4_ = local_12e0._24_4_ * 0.0;
            auVar32._28_4_ = local_12e0._28_4_;
            auVar80 = vminps_avx(auVar32,auVar117);
            auVar67 = vsubps_avx(auVar117,auVar69);
            auVar20 = vsubps_avx(auVar117,auVar80);
            local_1200 = vblendvps_avx(auVar80,auVar67,local_1100);
            local_1220 = vblendvps_avx(auVar69,auVar20,local_1100);
            fVar101 = local_1120._0_4_;
            fVar105 = local_1120._4_4_;
            fVar106 = local_1120._8_4_;
            fVar107 = local_1120._12_4_;
            fVar17 = local_1120._16_4_;
            fVar18 = local_1120._20_4_;
            fVar19 = local_1120._24_4_;
            local_11a0._0_4_ = auVar91._0_4_ * fVar101;
            local_11a0._4_4_ = auVar91._4_4_ * fVar105;
            local_11a0._8_4_ = auVar91._8_4_ * fVar106;
            local_11a0._12_4_ = auVar91._12_4_ * fVar107;
            local_11a0._16_4_ = fVar17 * 0.0;
            local_11a0._20_4_ = fVar18 * 0.0;
            local_11a0._24_4_ = fVar19 * 0.0;
            local_11a0._28_4_ = 0;
            local_1180._0_4_ = fVar101 * fVar1;
            local_1180._4_4_ = fVar105 * fVar2;
            local_1180._8_4_ = fVar106 * fVar15;
            local_1180._12_4_ = fVar107 * fVar16;
            local_1180._16_4_ = fVar17 * 0.0;
            local_1180._20_4_ = fVar18 * 0.0;
            local_1180._24_4_ = fVar19 * 0.0;
            local_1180._28_4_ = 0;
            local_11c0[0] = auVar73._0_4_ * fVar101;
            local_11c0[1] = auVar73._4_4_ * fVar105;
            local_11c0[2] = auVar73._8_4_ * fVar106;
            local_11c0[3] = auVar73._12_4_ * fVar107;
            fStack_11b0 = fVar17 * 0.0;
            fStack_11ac = fVar18 * 0.0;
            fStack_11a8 = fVar19 * 0.0;
            uStack_11a4 = local_1220._28_4_;
            auVar68._8_4_ = 0x7f800000;
            auVar68._0_8_ = 0x7f8000007f800000;
            auVar68._12_4_ = 0x7f800000;
            auVar68._16_4_ = 0x7f800000;
            auVar68._20_4_ = 0x7f800000;
            auVar68._24_4_ = 0x7f800000;
            auVar68._28_4_ = 0x7f800000;
            auVar99 = vblendvps_avx(auVar68,local_11e0,auVar99);
            auVar69 = vshufps_avx(auVar99,auVar99,0xb1);
            auVar69 = vminps_avx(auVar99,auVar69);
            auVar80 = vshufpd_avx(auVar69,auVar69,5);
            auVar69 = vminps_avx(auVar69,auVar80);
            auVar80 = vpermpd_avx2(auVar69,0x4e);
            auVar69 = vminps_avx(auVar69,auVar80);
            auVar99 = vcmpps_avx(auVar99,auVar69,0);
            auVar74 = vpackssdw_avx(auVar99._0_16_,auVar99._16_16_);
            auVar75 = vpand_avx(auVar74,auVar75);
            auVar99 = vpmovzxwd_avx2(auVar75);
            auVar69 = vpslld_avx2(auVar99,0x1f);
            auVar99 = local_14c0;
            if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar69 >> 0x7f,0) != '\0') ||
                  (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar69 >> 0xbf,0) != '\0') ||
                (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar69[0x1f] < '\0') {
              auVar99 = vpsrad_avx2(auVar69,0x1f);
            }
            auVar100 = ZEXT3264(auVar99);
LAB_005fe22a:
            uVar37 = vmovmskps_avx(auVar100._0_32_);
            uVar108 = 0;
            for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x80000000) {
              uVar108 = uVar108 + 1;
            }
            uVar44 = (ulong)uVar108;
            uVar37 = *(uint *)((long)&local_10e0 + uVar44 * 4);
            pGVar9 = (pSVar7->geometries).items[uVar37].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_14c0 + uVar44 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar44 = (ulong)(uVar108 << 2);
                uVar43 = *(undefined4 *)(local_1220 + uVar44);
                uVar3 = *(undefined4 *)(local_1200 + uVar44);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar44);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)((long)local_11c0 + uVar44);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11a0 + uVar44);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1180 + uVar44);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar43;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_1340 + uVar44);
                *(uint *)(ray + k * 4 + 0x240) = uVar37;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                goto LAB_005fe059;
              }
              local_14a0 = auVar72._0_32_;
              uVar42 = (ulong)(uVar108 * 4);
              uVar43 = *(undefined4 *)(local_1220 + uVar42);
              local_1060._4_4_ = uVar43;
              local_1060._0_4_ = uVar43;
              local_1060._8_4_ = uVar43;
              local_1060._12_4_ = uVar43;
              local_1060._16_4_ = uVar43;
              local_1060._20_4_ = uVar43;
              local_1060._24_4_ = uVar43;
              local_1060._28_4_ = uVar43;
              local_1040 = *(undefined4 *)(local_1200 + uVar42);
              uVar43 = *(undefined4 *)((long)&local_1340 + uVar42);
              auVar85._4_4_ = uVar43;
              auVar85._0_4_ = uVar43;
              auVar85._8_4_ = uVar43;
              auVar85._12_4_ = uVar43;
              auVar87._16_4_ = uVar43;
              auVar87._0_16_ = auVar85;
              auVar87._20_4_ = uVar43;
              auVar87._24_4_ = uVar43;
              auVar87._28_4_ = uVar43;
              uVar43 = *(undefined4 *)((long)local_11c0 + uVar42);
              uVar3 = *(undefined4 *)(local_11a0 + uVar42);
              local_10a0._4_4_ = uVar3;
              local_10a0._0_4_ = uVar3;
              local_10a0._8_4_ = uVar3;
              local_10a0._12_4_ = uVar3;
              local_10a0._16_4_ = uVar3;
              local_10a0._20_4_ = uVar3;
              local_10a0._24_4_ = uVar3;
              local_10a0._28_4_ = uVar3;
              uVar3 = *(undefined4 *)(local_1180 + uVar42);
              local_1080._4_4_ = uVar3;
              local_1080._0_4_ = uVar3;
              local_1080._8_4_ = uVar3;
              local_1080._12_4_ = uVar3;
              local_1080._16_4_ = uVar3;
              local_1080._20_4_ = uVar3;
              local_1080._24_4_ = uVar3;
              local_1080._28_4_ = uVar3;
              auVar79._4_4_ = uVar37;
              auVar79._0_4_ = uVar37;
              auVar79._8_4_ = uVar37;
              auVar79._12_4_ = uVar37;
              auVar82._16_4_ = uVar37;
              auVar82._0_16_ = auVar79;
              auVar82._20_4_ = uVar37;
              auVar82._24_4_ = uVar37;
              auVar82._28_4_ = uVar37;
              local_10c0[0] = (RTCHitN)(char)uVar43;
              local_10c0[1] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[2] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[3] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              local_10c0[4] = (RTCHitN)(char)uVar43;
              local_10c0[5] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[6] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[7] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              local_10c0[8] = (RTCHitN)(char)uVar43;
              local_10c0[9] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[10] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[0xb] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              local_10c0[0xc] = (RTCHitN)(char)uVar43;
              local_10c0[0xd] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[0xe] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[0xf] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              local_10c0[0x10] = (RTCHitN)(char)uVar43;
              local_10c0[0x11] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              local_10c0[0x14] = (RTCHitN)(char)uVar43;
              local_10c0[0x15] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              local_10c0[0x18] = (RTCHitN)(char)uVar43;
              local_10c0[0x19] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              local_10c0[0x1c] = (RTCHitN)(char)uVar43;
              local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar43 >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar43 >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar43 >> 0x18);
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              local_1020 = auVar87;
              local_1000 = auVar82;
              vpcmpeqd_avx2(local_1060,local_1060);
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              uVar43 = *(undefined4 *)(ray + k * 4 + 0x100);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar42);
              local_1480 = local_1140._0_8_;
              uStack_1478 = local_1140._8_8_;
              uStack_1470 = local_1140._16_8_;
              uStack_1468 = local_1140._24_8_;
              local_14f0.valid = (int *)&local_1480;
              local_14f0.geometryUserPtr = pGVar9->userPtr;
              local_14f0.context = context->user;
              local_14f0.hit = local_10c0;
              local_14f0.N = 8;
              local_14f0.ray = (RTCRayN *)ray;
              if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar82 = ZEXT1632(auVar79);
                auVar87 = ZEXT1632(auVar85);
                (*pGVar9->intersectionFilterN)(&local_14f0);
              }
              auVar33._8_8_ = uStack_1478;
              auVar33._0_8_ = local_1480;
              auVar33._16_8_ = uStack_1470;
              auVar33._24_8_ = uStack_1468;
              auVar69 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar33);
              auVar99 = _DAT_0205a980 & ~auVar69;
              if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar99 >> 0x7f,0) == '\0') &&
                    (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar99 >> 0xbf,0) == '\0') &&
                  (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar99[0x1f]) {
                auVar72 = ZEXT3264(auVar69 ^ _DAT_0205a980);
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar82 = ZEXT1632(auVar82._0_16_);
                  auVar87 = ZEXT1632(auVar87._0_16_);
                  (*p_Var13)(&local_14f0);
                }
                auVar34._8_8_ = uStack_1478;
                auVar34._0_8_ = local_1480;
                auVar34._16_8_ = uStack_1470;
                auVar34._24_8_ = uStack_1468;
                auVar69 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar34);
                auVar99 = vpcmpeqd_avx2(auVar87,auVar87);
                auVar72 = ZEXT3264(auVar69 ^ auVar99);
                auVar80 = vpcmpeqd_avx2(auVar82,auVar82);
                auVar99 = auVar99 & ~auVar69;
                if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar99 >> 0x7f,0) != '\0') ||
                      (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar99 >> 0xbf,0) != '\0') ||
                    (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar99[0x1f] < '\0') {
                  auVar69 = auVar69 ^ auVar80;
                  auVar99 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])local_14f0.hit);
                  *(undefined1 (*) [32])(local_14f0.ray + 0x180) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0x20));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x1a0) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0x40));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x1c0) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0x60));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x1e0) = auVar99;
                  auVar99 = vmaskmovps_avx(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0x80));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x200) = auVar99;
                  auVar99 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0xa0));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x220) = auVar99;
                  auVar99 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0xc0));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x240) = auVar99;
                  auVar99 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0xe0));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x260) = auVar99;
                  auVar99 = vpmaskmovd_avx2(auVar69,*(undefined1 (*) [32])(local_14f0.hit + 0x100));
                  *(undefined1 (*) [32])(local_14f0.ray + 0x280) = auVar99;
                }
              }
              auVar99 = auVar72._0_32_;
              if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar99 >> 0x7f,0) == '\0') &&
                    (auVar72 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                   SUB321(auVar99 >> 0xbf,0) == '\0') &&
                  (auVar72 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                  -1 < auVar72[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar43;
              }
              *(undefined4 *)(local_14c0 + uVar44 * 4) = 0;
              uVar43 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar71._4_4_ = uVar43;
              auVar71._0_4_ = uVar43;
              auVar71._8_4_ = uVar43;
              auVar71._12_4_ = uVar43;
              auVar71._16_4_ = uVar43;
              auVar71._20_4_ = uVar43;
              auVar71._24_4_ = uVar43;
              auVar71._28_4_ = uVar43;
              auVar72 = ZEXT3264(local_14a0);
              auVar99 = vcmpps_avx(local_14a0,auVar71,2);
              local_14c0 = vandps_avx(auVar99,local_14c0);
            }
            auVar100 = ZEXT3264(local_14c0);
            if ((((((((local_14c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_14c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_14c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_14c0 >> 0x7f,0) == '\0') &&
                  (local_14c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_14c0 >> 0xbf,0) == '\0') &&
                (local_14c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_14c0[0x1f]) goto LAB_005fe059;
            auVar70._8_4_ = 0x7f800000;
            auVar70._0_8_ = 0x7f8000007f800000;
            auVar70._12_4_ = 0x7f800000;
            auVar70._16_4_ = 0x7f800000;
            auVar70._20_4_ = 0x7f800000;
            auVar70._24_4_ = 0x7f800000;
            auVar70._28_4_ = 0x7f800000;
            auVar99 = vblendvps_avx(auVar70,auVar72._0_32_,local_14c0);
            auVar69 = vshufps_avx(auVar99,auVar99,0xb1);
            auVar69 = vminps_avx(auVar99,auVar69);
            auVar80 = vshufpd_avx(auVar69,auVar69,5);
            auVar69 = vminps_avx(auVar69,auVar80);
            auVar80 = vpermpd_avx2(auVar69,0x4e);
            auVar69 = vminps_avx(auVar69,auVar80);
            auVar99 = vcmpps_avx(auVar99,auVar69,0);
            auVar69 = local_14c0 & auVar99;
            if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar69 >> 0x7f,0) != '\0') ||
                  (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar69 >> 0xbf,0) != '\0') ||
                (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar69[0x1f] < '\0') {
              auVar99 = vandps_avx(auVar99,local_14c0);
              auVar100 = ZEXT3264(auVar99);
            }
            goto LAB_005fe22a;
          }
        }
LAB_005fe059:
        lVar40 = lVar40 + 1;
      } while (lVar40 != uVar38 - 8);
    }
    uVar43 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar72 = ZEXT1664(CONCAT412(uVar43,CONCAT48(uVar43,CONCAT44(uVar43,uVar43))));
    auVar100 = ZEXT1664(local_1400);
    auVar104 = ZEXT1664(local_1410);
    auVar111 = ZEXT1664(local_1420);
    auVar115 = ZEXT1664(local_1430);
    auVar118 = ZEXT1664(local_1440);
    auVar120 = ZEXT1664(local_1450);
    auVar124 = ZEXT1664(local_1460);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }